

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

void __thiscall
LASquadtree::intersect_circle_with_cells
          (LASquadtree *this,F64 center_x,F64 center_y,F64 radius,F64 r_min_x,F64 r_min_y,
          F64 r_max_x,F64 r_max_y,F32 cell_min_x,F32 cell_max_x,F32 cell_min_y,F32 cell_max_y,
          U32 level,U32 level_index)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator __position;
  BOOL BVar1;
  U32 level_index_00;
  U32 level_index_01;
  U32 level_00;
  float cell_max_x_00;
  F32 cell_max_y_00;
  float cell_mid_x;
  float cell_max_x_01;
  F32 cell_max_y_01;
  U32 local_1c;
  
  if (level == 0) {
    BVar1 = intersect_circle_with_rectangle
                      (this,center_x,center_y,radius,cell_min_x,cell_max_x,cell_min_y,cell_max_y);
    if (!BVar1) {
      return;
    }
    this_00 = (vector<int,_std::allocator<int>_> *)this->current_cells;
    __position._M_current =
         (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current !=
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      *__position._M_current = level_index;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
      return;
    }
    local_1c = level_index;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (this_00,__position,(int *)&local_1c);
    return;
  }
  level_00 = level - 1;
  level_index_01 = level_index << 2;
  cell_max_x_00 = ((float)cell_min_x + (float)cell_max_x) * 0.5;
  cell_max_y_00 = (F32)(((float)cell_min_y + (float)cell_max_y) * 0.5);
  if ((double)r_max_x <= (double)cell_max_x_00) {
    cell_max_x = (F32)cell_max_x_00;
    if ((double)(float)cell_max_y_00 < (double)r_max_y) {
      if ((double)r_min_y < (double)(float)cell_max_y_00) {
        intersect_circle_with_cells
                  (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                   (F32)cell_max_x_00,cell_min_y,cell_max_y_00,level_00,level_index_01);
        level_index_01 = level_index_01 | 2;
        cell_min_y = cell_max_y_00;
        cell_max_y_00 = cell_max_y;
      }
      else {
        level_index_01 = level_index_01 | 2;
        cell_min_y = cell_max_y_00;
        cell_max_y_00 = cell_max_y;
      }
    }
    goto LAB_0012587a;
  }
  if ((double)cell_max_x_00 <= (double)r_min_x) {
    if ((double)r_max_y <= (double)(float)cell_max_y_00) {
      level_index_01 = level_index_01 | 1;
      cell_min_x = (F32)cell_max_x_00;
      goto LAB_0012587a;
    }
    if ((double)(float)cell_max_y_00 <= (double)r_min_y) {
      level_index_01 = level_index_01 | 3;
      cell_min_x = (F32)cell_max_x_00;
      cell_min_y = cell_max_y_00;
      cell_max_y_00 = cell_max_y;
      goto LAB_0012587a;
    }
    level_index_00 = level_index_01 | 1;
    cell_min_x = (F32)cell_max_x_00;
    cell_max_x_01 = (float)cell_max_x;
    cell_max_y_01 = cell_max_y_00;
  }
  else {
    if ((double)r_max_y <= (double)(float)cell_max_y_00) {
      intersect_circle_with_cells
                (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                 (F32)cell_max_x_00,cell_min_y,cell_max_y_00,level_00,level_index_01);
      level_index_01 = level_index_01 | 1;
      cell_min_x = (F32)cell_max_x_00;
      goto LAB_0012587a;
    }
    if ((double)r_min_y < (double)(float)cell_max_y_00) {
      intersect_circle_with_cells
                (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                 (F32)cell_max_x_00,cell_min_y,cell_max_y_00,level_00,level_index_01);
      intersect_circle_with_cells
                (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,(F32)cell_max_x_00,
                 cell_max_x,cell_min_y,cell_max_y_00,level_00,level_index_01 | 1);
    }
    level_index_00 = level_index_01 | 2;
    cell_max_x_01 = cell_max_x_00;
    cell_min_y = cell_max_y_00;
    cell_max_y_01 = cell_max_y;
  }
  intersect_circle_with_cells
            (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
             (F32)cell_max_x_01,cell_min_y,cell_max_y_01,level_00,level_index_00);
  level_index_01 = level_index_01 | 3;
  cell_min_x = (F32)cell_max_x_00;
  cell_min_y = cell_max_y_00;
  cell_max_y_00 = cell_max_y;
LAB_0012587a:
  intersect_circle_with_cells
            (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,cell_max_x,
             cell_min_y,cell_max_y_00,level_00,level_index_01);
  return;
}

Assistant:

void LASquadtree::intersect_circle_with_cells(const F64 center_x, const F64 center_y, const F64 radius, const F64 r_min_x, const F64 r_min_y, const F64 r_max_x, const F64 r_max_y, const F32 cell_min_x, const F32 cell_max_x, const F32 cell_min_y, const F32 cell_max_y, U32 level, U32 level_index)
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  if (level)
  {
    level--;
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (r_max_x <= cell_mid_x)
    {
      // cell_max_x = cell_mid_x;
      if (r_max_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
      }
      else if (!(r_min_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
      else
      {
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
    }
    else if (!(r_min_x < cell_mid_x))
    {
      // cell_min_x = cell_mid_x;
      // level_index |= 1;
      if (r_max_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(r_min_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
    else
    {
      if (r_max_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(r_min_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
  }
  else
  {
    if (intersect_circle_with_rectangle(center_x, center_y, radius, cell_min_x, cell_max_x, cell_min_y, cell_max_y))
    {
      ((my_cell_vector*)current_cells)->push_back(level_index);
    }
  }
}